

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_suite.cpp
# Opt level: O0

void assign_suite::assign_signed_int_with_real(void)

{
  undefined1 local_3db;
  undefined1 local_3da [2];
  undefined1 local_3d8 [8];
  variable number_5;
  undefined1 local_39b;
  undefined1 local_39a [2];
  undefined1 local_398 [8];
  variable data_8;
  undefined1 local_35b;
  undefined1 local_35a [2];
  undefined1 local_358 [8];
  variable number_4;
  undefined1 local_31b;
  undefined1 local_31a [2];
  undefined1 local_318 [8];
  variable data_7;
  undefined1 local_2de;
  undefined1 local_2dd [2];
  undefined1 local_2db;
  undefined1 local_2da [2];
  undefined1 local_2d8 [8];
  variable data_6;
  undefined1 local_29b;
  undefined1 local_29a [2];
  undefined1 local_298 [8];
  variable number_3;
  undefined1 local_25b;
  undefined1 local_25a [2];
  undefined1 local_258 [8];
  variable data_5;
  undefined1 local_21b;
  undefined1 local_21a [2];
  undefined1 local_218 [8];
  variable number_2;
  undefined1 local_1db;
  undefined1 local_1da [2];
  undefined1 local_1d8 [8];
  variable data_4;
  undefined1 local_19e;
  undefined1 local_19d [2];
  undefined1 local_19b;
  undefined1 local_19a [2];
  undefined1 local_198 [8];
  variable data_3;
  undefined1 local_15b;
  undefined1 local_15a [2];
  undefined1 local_158 [8];
  variable number_1;
  undefined1 local_11b;
  undefined1 local_11a [2];
  undefined1 local_118 [8];
  variable data_2;
  undefined1 local_db;
  undefined1 local_da [2];
  undefined1 local_d8 [8];
  variable number;
  undefined1 local_9b;
  undefined1 local_9a [2];
  undefined1 local_98 [8];
  variable data_1;
  undefined1 local_5f;
  undefined1 local_5e [19];
  undefined1 local_4b;
  undefined1 local_4a [2];
  undefined1 local_48 [8];
  variable data;
  int input;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>
            ((basic_variable<std::allocator<char>_> *)local_48,2);
  local_4a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<int>
                          ((basic_variable<std::allocator<char>_> *)local_48);
  local_4b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xc83,"void assign_suite::assign_signed_int_with_real()",local_4a,&local_4b);
  trial::dynamic::basic_variable<std::allocator<char>>::operator=
            ((basic_variable<std::allocator<char>> *)local_48,3.0);
  local_5e[0] = trial::dynamic::basic_variable<std::allocator<char>_>::same<float>
                          ((basic_variable<std::allocator<char>_> *)local_48);
  local_5f = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<float>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xc85,"void assign_suite::assign_signed_int_with_real()",local_5e,&local_5f);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_48);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>
            ((basic_variable<std::allocator<char>_> *)local_98,2);
  local_9a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<int>
                          ((basic_variable<std::allocator<char>_> *)local_98);
  local_9b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xc89,"void assign_suite::assign_signed_int_with_real()",local_9a,&local_9b);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>
            ((basic_variable<std::allocator<char>_> *)local_d8,3.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::operator=
            ((basic_variable<std::allocator<char>_> *)local_98,
             (basic_variable<std::allocator<char>_> *)local_d8);
  local_da[0] = trial::dynamic::basic_variable<std::allocator<char>_>::same<float>
                          ((basic_variable<std::allocator<char>_> *)local_98);
  local_db = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<float>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xc8c,"void assign_suite::assign_signed_int_with_real()",local_da,&local_db);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_98);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>
            ((basic_variable<std::allocator<char>_> *)local_118,2);
  local_11a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<int>
                           ((basic_variable<std::allocator<char>_> *)local_118);
  local_11b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xc90,"void assign_suite::assign_signed_int_with_real()",local_11a,&local_11b);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>
            ((basic_variable<std::allocator<char>_> *)local_158,3.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::operator=
            ((basic_variable<std::allocator<char>_> *)local_118,
             (basic_variable<std::allocator<char>_> *)local_158);
  local_15a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::same<float>
                           ((basic_variable<std::allocator<char>_> *)local_118);
  local_15b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<float>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xc93,"void assign_suite::assign_signed_int_with_real()",local_15a,&local_15b);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_158);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_118);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>
            ((basic_variable<std::allocator<char>_> *)local_198,2);
  local_19a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<int>
                           ((basic_variable<std::allocator<char>_> *)local_198);
  local_19b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xc97,"void assign_suite::assign_signed_int_with_real()",local_19a,&local_19b);
  trial::dynamic::basic_variable<std::allocator<char>>::operator=
            ((basic_variable<std::allocator<char>> *)local_198,3.0);
  local_19d[0] = trial::dynamic::basic_variable<std::allocator<char>_>::same<double>
                           ((basic_variable<std::allocator<char>_> *)local_198);
  local_19e = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<double>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xc99,"void assign_suite::assign_signed_int_with_real()",local_19d,&local_19e);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_198);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>
            ((basic_variable<std::allocator<char>_> *)local_1d8,2);
  local_1da[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<int>
                           ((basic_variable<std::allocator<char>_> *)local_1d8);
  local_1db = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xc9d,"void assign_suite::assign_signed_int_with_real()",local_1da,&local_1db);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>
            ((basic_variable<std::allocator<char>_> *)local_218,3.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::operator=
            ((basic_variable<std::allocator<char>_> *)local_1d8,
             (basic_variable<std::allocator<char>_> *)local_218);
  local_21a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::same<double>
                           ((basic_variable<std::allocator<char>_> *)local_1d8);
  local_21b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<double>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xca0,"void assign_suite::assign_signed_int_with_real()",local_21a,&local_21b);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_218);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_1d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>
            ((basic_variable<std::allocator<char>_> *)local_258,2);
  local_25a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<int>
                           ((basic_variable<std::allocator<char>_> *)local_258);
  local_25b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xca4,"void assign_suite::assign_signed_int_with_real()",local_25a,&local_25b);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>
            ((basic_variable<std::allocator<char>_> *)local_298,3.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::operator=
            ((basic_variable<std::allocator<char>_> *)local_258,
             (basic_variable<std::allocator<char>_> *)local_298);
  local_29a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::same<double>
                           ((basic_variable<std::allocator<char>_> *)local_258);
  local_29b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<double>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xca7,"void assign_suite::assign_signed_int_with_real()",local_29a,&local_29b);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_298);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_258);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>
            ((basic_variable<std::allocator<char>_> *)local_2d8,2);
  local_2da[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<int>
                           ((basic_variable<std::allocator<char>_> *)local_2d8);
  local_2db = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xcab,"void assign_suite::assign_signed_int_with_real()",local_2da,&local_2db);
  trial::dynamic::basic_variable<std::allocator<char>>::operator=
            ((basic_variable<std::allocator<char>> *)local_2d8,(longdouble)3.0);
  local_2dd[0] = trial::dynamic::basic_variable<std::allocator<char>_>::same<long_double>
                           ((basic_variable<std::allocator<char>_> *)local_2d8);
  local_2de = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<long double>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xcad,"void assign_suite::assign_signed_int_with_real()",local_2dd,&local_2de);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_2d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>
            ((basic_variable<std::allocator<char>_> *)local_318,2);
  local_31a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<int>
                           ((basic_variable<std::allocator<char>_> *)local_318);
  local_31b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xcb1,"void assign_suite::assign_signed_int_with_real()",local_31a,&local_31b);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long_double>
            ((basic_variable<std::allocator<char>_> *)local_358,(longdouble)3.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::operator=
            ((basic_variable<std::allocator<char>_> *)local_318,
             (basic_variable<std::allocator<char>_> *)local_358);
  local_35a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::same<long_double>
                           ((basic_variable<std::allocator<char>_> *)local_318);
  local_35b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<long double>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xcb4,"void assign_suite::assign_signed_int_with_real()",local_35a,&local_35b);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_358);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_318);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>
            ((basic_variable<std::allocator<char>_> *)local_398,2);
  local_39a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<int>
                           ((basic_variable<std::allocator<char>_> *)local_398);
  local_39b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xcb8,"void assign_suite::assign_signed_int_with_real()",local_39a,&local_39b);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long_double>
            ((basic_variable<std::allocator<char>_> *)local_3d8,(longdouble)3.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::operator=
            ((basic_variable<std::allocator<char>_> *)local_398,
             (basic_variable<std::allocator<char>_> *)local_3d8);
  local_3da[0] = trial::dynamic::basic_variable<std::allocator<char>_>::same<long_double>
                           ((basic_variable<std::allocator<char>_> *)local_398);
  local_3db = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<long double>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xcbb,"void assign_suite::assign_signed_int_with_real()",local_3da,&local_3db);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_3d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_398);
  return;
}

Assistant:

void assign_signed_int_with_real()
{
    signed int input = 2;
    {
        variable data(input);
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<int>(), true);
        data = 3.0f;
        TRIAL_PROTOCOL_TEST_EQUAL(data.same<float>(), true);
    }
    {
        variable data(input);
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<int>(), true);
        variable number(3.0f);
        data = number;
        TRIAL_PROTOCOL_TEST_EQUAL(data.same<float>(), true);
    }
    {
        variable data(input);
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<int>(), true);
        variable number(3.0f);
        data = std::move(number);
        TRIAL_PROTOCOL_TEST_EQUAL(data.same<float>(), true);
    }
    {
        variable data(input);
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<int>(), true);
        data = 3.0;
        TRIAL_PROTOCOL_TEST_EQUAL(data.same<double>(), true);
    }
    {
        variable data(input);
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<int>(), true);
        variable number(3.0);
        data = number;
        TRIAL_PROTOCOL_TEST_EQUAL(data.same<double>(), true);
    }
    {
        variable data(input);
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<int>(), true);
        variable number(3.0);
        data = std::move(number);
        TRIAL_PROTOCOL_TEST_EQUAL(data.same<double>(), true);
    }
    {
        variable data(input);
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<int>(), true);
        data = 3.0L;
        TRIAL_PROTOCOL_TEST_EQUAL(data.same<long double>(), true);
    }
    {
        variable data(input);
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<int>(), true);
        variable number(3.0L);
        data = number;
        TRIAL_PROTOCOL_TEST_EQUAL(data.same<long double>(), true);
    }
    {
        variable data(input);
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<int>(), true);
        variable number(3.0L);
        data = std::move(number);
        TRIAL_PROTOCOL_TEST_EQUAL(data.same<long double>(), true);
    }
}